

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::LegacyScriptPubKeyMan::KeepDestination
          (LegacyScriptPubKeyMan *this,int64_t nIndex,OutputType *type)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  long in_FS_OFFSET;
  WalletBatch local_90;
  int64_t nIndex_local;
  CPubKey pubkey;
  WalletDatabase *pWVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nIndex_local = nIndex;
  if (*type == BECH32M) {
    __assert_fail("type != OutputType::BECH32M",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x570,
                  "virtual void wallet::LegacyScriptPubKeyMan::KeepDestination(int64_t, const OutputType &)"
                 );
  }
  iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar3 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
  (*pWVar3->_vptr_WalletDatabase[0xe])(&local_90,pWVar3,1);
  local_90.m_database = pWVar3;
  WalletBatch::ErasePool(&local_90,nIndex);
  pubkey.vch[0] = 0xff;
  pmVar4 = std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
           ::at(&this->m_index_to_reserved_key,&nIndex_local);
  iVar2 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1f])
                    (this,pmVar4,&pubkey);
  if ((char)iVar2 != '\0') {
    LearnRelatedScripts(this,&pubkey,*type);
    std::
    _Rb_tree<long,_std::pair<const_long,_CKeyID>,_std::_Select1st<std::pair<const_long,_CKeyID>_>,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
    ::erase(&(this->m_index_to_reserved_key)._M_t,&nIndex_local);
    ScriptPubKeyMan::WalletLogPrintf<long>
              ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0xe01be0,&nIndex_local);
    if ((_Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
        local_90.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl != (DatabaseBatch *)0x0)
    {
      (*(*(_func_int ***)
          local_90.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("have_pk",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                ,0x576,
                "virtual void wallet::LegacyScriptPubKeyMan::KeepDestination(int64_t, const OutputType &)"
               );
}

Assistant:

void LegacyScriptPubKeyMan::KeepDestination(int64_t nIndex, const OutputType& type)
{
    assert(type != OutputType::BECH32M);
    // Remove from key pool
    WalletBatch batch(m_storage.GetDatabase());
    batch.ErasePool(nIndex);
    CPubKey pubkey;
    bool have_pk = GetPubKey(m_index_to_reserved_key.at(nIndex), pubkey);
    assert(have_pk);
    LearnRelatedScripts(pubkey, type);
    m_index_to_reserved_key.erase(nIndex);
    WalletLogPrintf("keypool keep %d\n", nIndex);
}